

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mip_level::convert(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  color_quad<unsigned_char,_int> *pcVar1;
  bool bVar2;
  component_flags cVar3;
  uint uVar4;
  image_u8 *piVar5;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  bool bVar13;
  image_u8 tmp_img;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_6c;
  image_u8 local_68;
  
  if (0x41315843 < (int)fmt) {
    if ((int)fmt < 0x52784778) {
      if ((int)fmt < 0x52424741) {
        if ((fmt == PIXEL_FMT_DXT1A) || (fmt == PIXEL_FMT_ETC2A)) goto LAB_0012e067;
      }
      else if ((fmt == PIXEL_FMT_DXT5_AGBR) || (fmt == PIXEL_FMT_DXT5_xGBR)) goto LAB_0012e067;
    }
    else if ((int)fmt < 0x53413245) {
      if ((fmt == PIXEL_FMT_DXT5_xGxR) || (fmt == PIXEL_FMT_ETC1S)) goto LAB_0012e067;
    }
    else if ((fmt == PIXEL_FMT_ETC2AS) || ((fmt == PIXEL_FMT_DXT5_CCxY || (fmt == PIXEL_FMT_DXN))))
    goto LAB_0012e067;
    goto LAB_0012e082;
  }
  if ((int)fmt < 0x32495441) {
    if ((int)fmt < 0x31545844) {
      if ((fmt == PIXEL_FMT_ETC1) || (fmt == PIXEL_FMT_DXT5A)) goto LAB_0012e067;
    }
    else if ((fmt == PIXEL_FMT_DXT1) || (fmt == PIXEL_FMT_ETC2)) goto LAB_0012e067;
  }
  else if ((int)fmt < 0x33545844) {
    if ((fmt == PIXEL_FMT_3DC) || (fmt == PIXEL_FMT_DXT2)) goto LAB_0012e067;
  }
  else if ((fmt == PIXEL_FMT_DXT3) || ((fmt == PIXEL_FMT_DXT4 || (fmt == PIXEL_FMT_DXT5)))) {
LAB_0012e067:
    bVar2 = pack_to_dxt(this,fmt,cook,p);
    return bVar2;
  }
LAB_0012e082:
  local_68.m_width = 0;
  local_68.m_height = 0;
  local_68.m_pitch = 0;
  local_68.m_total = 0;
  local_68.m_comp_flags = 0xf;
  local_68.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  local_68.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  local_68.m_pixel_buf.m_size = 0;
  local_68.m_pixel_buf.m_capacity = 0;
  piVar5 = get_unpacked_image(this,&local_68,1);
  this_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
  this_00->m_width = 0;
  this_00->m_height = 0;
  this_00->m_pitch = 0;
  this_00->m_total = 0;
  this_00->m_comp_flags = 0xf;
  this_00->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  (this_00->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
  (this_00->m_pixel_buf).m_size = 0;
  (this_00->m_pixel_buf).m_capacity = 0;
  cVar3 = pixel_format_helpers::get_component_flags(fmt);
  this_00->m_comp_flags = cVar3;
  local_6c.m_u32 = 0xff000000;
  bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::resize
                    (this_00,piVar5->m_width,piVar5->m_height,0xffffffff,
                     (color_quad<unsigned_char,_int> *)&local_6c.field_0);
  if (bVar2) {
    uVar6 = piVar5->m_height;
    if (uVar6 != 0) {
      uVar12 = piVar5->m_width;
      uVar4 = 0;
      do {
        bVar13 = uVar12 != 0;
        uVar12 = 0;
        if (bVar13) {
          uVar7 = 0;
          do {
            pcVar1 = piVar5->m_pPixels;
            uVar12 = piVar5->m_pitch * uVar4 + uVar7;
            bVar10 = pcVar1[uVar12].field_0.field_0.r;
            bVar9 = pcVar1[uVar12].field_0.field_0.g;
            bVar8 = pcVar1[uVar12].field_0.field_0.b;
            if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5A)) &&
               ((piVar5->m_comp_flags & 8) == 0)) {
              bVar11 = (byte)((uint)bVar8 * 0x1d2f + (uint)bVar9 * 0x9646 + (uint)bVar10 * 0x4c8b +
                              0x8000 >> 0x10);
            }
            else {
              if ((this_00->m_comp_flags & 0x10) != 0) {
                bVar10 = (byte)((uint)bVar8 * 0x1d2f + (uint)bVar9 * 0x9646 + (uint)bVar10 * 0x4c8b
                                + 0x8000 >> 0x10);
                bVar9 = bVar10;
                bVar8 = bVar10;
              }
              bVar11 = -((this_00->m_comp_flags & 8) == 0) | pcVar1[uVar12].field_0.field_0.a;
            }
            pcVar1 = this_00->m_pPixels;
            uVar12 = this_00->m_pitch * uVar4 + uVar7;
            pcVar1[uVar12].field_0.field_0.r = bVar10;
            pcVar1[uVar12].field_0.field_0.g = bVar9;
            pcVar1[uVar12].field_0.field_0.b = bVar8;
            pcVar1[uVar12].field_0.field_0.a = bVar11;
            uVar7 = uVar7 + 1;
            uVar12 = piVar5->m_width;
          } while (uVar7 < uVar12);
          uVar6 = piVar5->m_height;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar6);
    }
    assign(this,this_00,fmt,this->m_orient_flags);
  }
  if (local_68.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(local_68.m_pixel_buf.m_p);
  }
  return bVar2;
}

Assistant:

bool mip_level::convert(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  if (pixel_format_helpers::is_dxt(fmt))
    return pack_to_dxt(fmt, cook, p);

  image_u8 tmp_img;
  image_u8* pImg = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  image_u8* pImage = crnlib_new<image_u8>();
  pImage->set_comp_flags(pixel_format_helpers::get_component_flags(fmt));

  if (!pImage->resize(pImg->get_width(), pImg->get_height()))
    return false;

  for (uint y = 0; y < pImg->get_height(); y++) {
    for (uint x = 0; x < pImg->get_width(); x++) {
      color_quad_u8 c((*pImg)(x, y));

      if ((pixel_format_helpers::is_alpha_only(fmt)) && (!pImg->has_alpha())) {
        c.a = static_cast<uint8>(c.get_luma());
      } else {
        if (pImage->is_grayscale()) {
          uint8 g = static_cast<uint8>(c.get_luma());
          c.r = g;
          c.g = g;
          c.b = g;
        }

        if (!pImage->is_component_valid(3))
          c.a = 255;
      }

      (*pImage)(x, y) = c;
    }
  }

  assign(pImage, fmt, m_orient_flags);

  return true;
}